

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O2

int crnlib::LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  UInt16 *pUVar5;
  Byte *pBVar6;
  short sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  UInt16 *pUVar16;
  ulong uVar17;
  UInt32 UVar18;
  uint uVar19;
  long lVar20;
  Byte *pBVar21;
  uint uVar22;
  uint uVar23;
  UInt32 mask;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  byte *pbVar29;
  ushort *puVar30;
  ulong uVar31;
  uint uVar32;
  uint uVar33;
  long lStack_f0;
  uint local_dc;
  UInt32 local_d8;
  UInt32 local_d4;
  UInt32 local_cc;
  ulong local_90;
  ulong uVar15;
  
  uVar27 = p->dicPos;
  do {
    uVar24 = p->processedPos;
    uVar4 = p->checkDicSize;
    local_90 = limit;
    if ((uVar4 == 0) &&
       (uVar11 = (ulong)((p->prop).dicSize - uVar24), local_90 = uVar27 + uVar11,
       limit - uVar27 <= uVar11)) {
      local_90 = limit;
    }
    pUVar5 = p->probs;
    uVar28 = p->state;
    local_dc = p->reps[0];
    local_d4 = p->reps[1];
    local_d8 = p->reps[2];
    uVar8 = (p->prop).pb;
    local_cc = p->reps[3];
    uVar9 = (p->prop).lp;
    pBVar6 = p->dic;
    uVar11 = p->dicBufSize;
    pbVar29 = p->buf;
    uVar10 = p->range;
    uVar12 = p->code;
    bVar2 = (byte)(p->prop).lc;
    uVar19 = 0;
LAB_0017c628:
    UVar18 = local_cc;
    uVar23 = local_dc;
    if (uVar10 < 0x1000000) {
      uVar10 = uVar10 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar1 | uVar12 << 8;
    }
    uVar13 = uVar24 & ~(-1 << ((byte)uVar8 & 0x1f));
    uVar15 = (ulong)uVar13;
    uVar17 = (ulong)(uVar28 << 4);
    uVar3 = pUVar5[uVar17 + uVar15];
    uVar22 = (uVar10 >> 0xb) * (uint)uVar3;
    uVar25 = (ulong)local_dc;
    uVar32 = uVar12 - uVar22;
    if (uVar12 < uVar22) {
      pUVar5[uVar17 + uVar15] = (short)(0x800 - uVar3 >> 5) + uVar3;
      pUVar16 = pUVar5 + 0x736;
      if (uVar24 != 0 || uVar4 != 0) {
        uVar15 = uVar27;
        if (uVar27 == 0) {
          uVar15 = uVar11;
        }
        pUVar16 = pUVar5 + 0x736 +
                  ((uint)(pBVar6[uVar15 - 1] >> (8 - bVar2 & 0x1f)) +
                  ((uVar24 & ~(-1 << ((byte)uVar9 & 0x1f))) << (bVar2 & 0x1f))) * 0x300;
      }
      uVar10 = uVar22;
      if (uVar28 < 7) {
        uVar15 = 1;
        do {
          uVar23 = uVar10;
          if (uVar10 < 0x1000000) {
            uVar23 = uVar10 << 8;
            bVar1 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar12 = uVar12 << 8 | (uint)bVar1;
          }
          uVar3 = pUVar16[uVar15];
          uVar10 = (uVar23 >> 0xb) * (uint)uVar3;
          uVar32 = (int)uVar15 * 2;
          uVar13 = uVar12 - uVar10;
          if (uVar12 < uVar10) {
            sVar7 = (short)(0x800 - uVar3 >> 5);
          }
          else {
            uVar10 = uVar23 - uVar10;
            sVar7 = -(uVar3 >> 5);
            uVar32 = uVar32 | 1;
            uVar12 = uVar13;
          }
          uVar25 = (ulong)uVar32;
          pUVar16[uVar15] = sVar7 + uVar3;
          uVar15 = uVar25;
        } while (uVar32 < 0x100);
      }
      else {
        uVar15 = 0;
        if (uVar27 < uVar25) {
          uVar15 = uVar11;
        }
        uVar23 = (uint)p->dic[uVar15 + (uVar27 - uVar25)];
        uVar15 = 1;
        uVar32 = 0x100;
        do {
          uVar13 = uVar12;
          uVar22 = uVar10;
          if (uVar10 < 0x1000000) {
            uVar22 = uVar10 << 8;
            bVar1 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar13 = uVar12 << 8 | (uint)bVar1;
          }
          uVar23 = uVar23 * 2;
          uVar33 = uVar23 & uVar32;
          uVar17 = (ulong)uVar33;
          uVar3 = pUVar16[(ulong)uVar32 + uVar17 + uVar15];
          uVar10 = (uVar22 >> 0xb) * (uint)uVar3;
          uVar26 = (int)uVar15 * 2;
          uVar12 = uVar13 - uVar10;
          if (uVar13 < uVar10) {
            sVar7 = (short)(0x800 - uVar3 >> 5);
            uVar33 = uVar33 ^ uVar32;
            uVar12 = uVar13;
          }
          else {
            uVar10 = uVar22 - uVar10;
            sVar7 = -(uVar3 >> 5);
            uVar26 = uVar26 | 1;
          }
          uVar25 = (ulong)uVar26;
          pUVar16[(ulong)uVar32 + uVar17 + uVar15] = sVar7 + uVar3;
          uVar15 = uVar25;
          uVar32 = uVar33;
        } while (uVar26 < 0x100);
      }
      pBVar6[uVar27] = (Byte)uVar25;
      uVar28 = (uint)(byte)kLiteralNextStates[uVar28];
LAB_0017c8a2:
      uVar27 = uVar27 + 1;
      uVar15 = 1;
      goto LAB_0017d229;
    }
    uVar10 = uVar10 - uVar22;
    pUVar5[uVar17 + uVar15] = uVar3 - (uVar3 >> 5);
    if (uVar10 < 0x1000000) {
      uVar10 = uVar10 * 0x100;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar32 = uVar32 * 0x100 | (uint)bVar1;
    }
    uVar3 = pUVar5[(ulong)uVar28 + 0xc0];
    uVar22 = (uVar10 >> 0xb) * (uint)uVar3;
    uVar12 = uVar32 - uVar22;
    if (uVar32 < uVar22) {
      pUVar5[(ulong)uVar28 + 0xc0] = (short)(0x800 - uVar3 >> 5) + uVar3;
      uVar28 = uVar28 + 0xc;
      puVar30 = pUVar5 + 0x332;
    }
    else {
      pUVar5[(ulong)uVar28 + 0xc0] = uVar3 - (uVar3 >> 5);
      if (uVar24 == 0 && uVar4 == 0) {
        return 1;
      }
      uVar10 = uVar10 - uVar22;
      if (uVar10 < 0x1000000) {
        uVar10 = uVar10 * 0x100;
        bVar1 = *pbVar29;
        pbVar29 = pbVar29 + 1;
        uVar12 = (uint)bVar1 | uVar12 * 0x100;
      }
      uVar3 = pUVar5[(ulong)uVar28 + 0xcc];
      uVar22 = (uVar10 >> 0xb) * (uint)uVar3;
      uVar32 = uVar12 - uVar22;
      if (uVar12 < uVar22) {
        pUVar5[(ulong)uVar28 + 0xcc] = (short)(0x800 - uVar3 >> 5) + uVar3;
        if (uVar22 < 0x1000000) {
          uVar22 = uVar22 * 0x100;
          bVar1 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar12 = (uint)bVar1 | uVar12 << 8;
        }
        uVar3 = pUVar5[uVar17 + uVar15 + 0xf0];
        uVar10 = (uVar22 >> 0xb) * (uint)uVar3;
        uVar32 = uVar12 - uVar10;
        if (uVar12 < uVar10) {
          pUVar5[uVar17 + uVar15 + 0xf0] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar15 = 0;
          if (uVar27 < uVar25) {
            uVar15 = uVar11;
          }
          pBVar6[uVar27] = pBVar6[uVar15 + (uVar27 - uVar25)];
          uVar28 = (uint)(6 < uVar28) * 2 + 9;
          goto LAB_0017c8a2;
        }
        uVar22 = uVar22 - uVar10;
        pUVar5[uVar17 + uVar15 + 0xf0] = uVar3 - (uVar3 >> 5);
        uVar23 = local_d4;
      }
      else {
        uVar10 = uVar10 - uVar22;
        pUVar5[(ulong)uVar28 + 0xcc] = uVar3 - (uVar3 >> 5);
        if (uVar10 < 0x1000000) {
          uVar10 = uVar10 * 0x100;
          bVar1 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar32 = uVar32 * 0x100 | (uint)bVar1;
        }
        uVar3 = pUVar5[(ulong)uVar28 + 0xd8];
        uVar22 = (uVar10 >> 0xb) * (uint)uVar3;
        uVar12 = uVar32 - uVar22;
        if (uVar32 < uVar22) {
          pUVar5[(ulong)uVar28 + 0xd8] = (short)(0x800 - uVar3 >> 5) + uVar3;
          local_dc = local_d4;
        }
        else {
          uVar10 = uVar10 - uVar22;
          pUVar5[(ulong)uVar28 + 0xd8] = uVar3 - (uVar3 >> 5);
          if (uVar10 < 0x1000000) {
            uVar10 = uVar10 * 0x100;
            bVar1 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            uVar12 = uVar12 * 0x100 | (uint)bVar1;
          }
          uVar3 = pUVar5[(ulong)uVar28 + 0xe4];
          uVar22 = (uVar10 >> 0xb) * (uint)uVar3;
          uVar32 = uVar12 - uVar22;
          if (uVar12 < uVar22) {
            sVar7 = (short)(0x800 - uVar3 >> 5);
            uVar32 = uVar12;
            UVar18 = local_d8;
          }
          else {
            uVar22 = uVar10 - uVar22;
            sVar7 = -(uVar3 >> 5);
            local_cc = local_d8;
          }
          pUVar5[(ulong)uVar28 + 0xe4] = sVar7 + uVar3;
          local_d8 = local_d4;
          local_dc = UVar18;
        }
      }
      uVar28 = (uint)(6 < uVar28) * 3 + 8;
      puVar30 = pUVar5 + 0x534;
      local_d4 = uVar23;
    }
    uVar3 = *puVar30;
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar32 = uVar32 << 8 | (uint)bVar1;
    }
    uVar10 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar19 = uVar32 - uVar10;
    if (uVar32 < uVar10) {
      *puVar30 = (short)(0x800 - uVar3 >> 5) + uVar3;
      puVar30 = puVar30 + (ulong)(uVar13 << 3) + 2;
      uVar23 = 8;
      uVar12 = uVar32;
      uVar19 = 0;
    }
    else {
      uVar22 = uVar22 - uVar10;
      *puVar30 = uVar3 - (uVar3 >> 5);
      if (uVar22 < 0x1000000) {
        uVar22 = uVar22 * 0x100;
        bVar1 = *pbVar29;
        pbVar29 = pbVar29 + 1;
        uVar19 = (uint)bVar1 | uVar19 * 0x100;
      }
      uVar3 = puVar30[1];
      uVar10 = (uVar22 >> 0xb) * (uint)uVar3;
      uVar12 = uVar19 - uVar10;
      if (uVar19 < uVar10) {
        puVar30[1] = (short)(0x800 - uVar3 >> 5) + uVar3;
        puVar30 = puVar30 + (ulong)(uVar13 << 3) + 0x82;
        uVar23 = 8;
        uVar12 = uVar19;
        uVar19 = uVar23;
      }
      else {
        uVar10 = uVar22 - uVar10;
        puVar30[1] = uVar3 - (uVar3 >> 5);
        puVar30 = puVar30 + 0x102;
        uVar23 = 0x100;
        uVar19 = 0x10;
      }
    }
    uVar15 = 1;
    do {
      uVar3 = puVar30[uVar15];
      uVar32 = uVar10;
      uVar13 = uVar12;
      if (uVar10 < 0x1000000) {
        uVar32 = uVar10 << 8;
        bVar1 = *pbVar29;
        pbVar29 = pbVar29 + 1;
        uVar13 = uVar12 << 8 | (uint)bVar1;
      }
      uVar10 = (uVar32 >> 0xb) * (uint)uVar3;
      uVar22 = (int)uVar15 * 2;
      uVar12 = uVar13 - uVar10;
      if (uVar13 < uVar10) {
        sVar7 = (short)(0x800 - uVar3 >> 5);
        uVar12 = uVar13;
      }
      else {
        uVar10 = uVar32 - uVar10;
        sVar7 = -(uVar3 >> 5);
        uVar22 = uVar22 | 1;
      }
      puVar30[uVar15] = sVar7 + uVar3;
      uVar15 = (ulong)uVar22;
    } while (uVar22 < uVar23);
    uVar19 = (uVar22 - uVar23) + uVar19;
    if (uVar28 < 0xc) {
LAB_0017d19e:
      uVar17 = local_90 - uVar27;
      if (uVar17 == 0) {
        return 1;
      }
      uVar19 = uVar19 + 2;
      uVar15 = uVar17 & 0xffffffff;
      if (uVar19 <= uVar17) {
        uVar15 = (ulong)uVar19;
      }
      uVar17 = 0;
      if (uVar27 < local_dc) {
        uVar17 = uVar11;
      }
      uVar17 = (uVar27 - local_dc) + uVar17;
      uVar19 = uVar19 - (int)uVar15;
      if (uVar11 < uVar17 + uVar15) {
        lVar20 = 0;
        do {
          pBVar6[lVar20 + uVar27] = pBVar6[uVar17];
          uVar17 = uVar17 + 1;
          if (uVar17 == uVar11) {
            uVar17 = 0;
          }
          lVar20 = lVar20 + 1;
        } while ((int)uVar15 != (int)lVar20);
        uVar27 = uVar27 + lVar20;
      }
      else {
        pBVar21 = pBVar6 + uVar27;
        uVar25 = uVar15;
        do {
          *pBVar21 = pBVar21[uVar17 - uVar27];
          pBVar21 = pBVar21 + 1;
          uVar25 = uVar25 - 1;
        } while (uVar25 != 0);
        uVar27 = uVar27 + uVar15;
      }
LAB_0017d229:
      uVar24 = uVar24 + (int)uVar15;
      if ((local_90 <= uVar27) || (bufLimit <= pbVar29)) goto LAB_0017d240;
      goto LAB_0017c628;
    }
    uVar23 = 3;
    if (uVar19 < 3) {
      uVar23 = uVar19;
    }
    if (uVar10 < 0x1000000) {
      uVar10 = uVar10 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar1 | uVar12 << 8;
    }
    uVar15 = (ulong)(uVar23 << 7);
    uVar3 = *(ushort *)((long)pUVar5 + uVar15 + 0x362);
    uVar32 = (uVar10 >> 0xb) * (uint)uVar3;
    uVar23 = uVar12 - uVar32;
    if (uVar12 < uVar32) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      lStack_f0 = 2;
      uVar23 = uVar12;
    }
    else {
      uVar32 = uVar10 - uVar32;
      sVar7 = -(uVar3 >> 5);
      lStack_f0 = 3;
    }
    lVar20 = uVar15 + 0x360;
    *(ushort *)((long)pUVar5 + uVar15 + 0x362) = sVar7 + uVar3;
    if (uVar32 < 0x1000000) {
      uVar32 = uVar32 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar23 = (uint)bVar1 | uVar23 << 8;
    }
    uVar3 = *(ushort *)((long)pUVar5 + lStack_f0 * 2 + lVar20);
    uVar13 = (uVar32 >> 0xb) * (uint)uVar3;
    uVar10 = (int)lStack_f0 * 2;
    uVar12 = uVar23 - uVar13;
    if (uVar23 < uVar13) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar12 = uVar23;
    }
    else {
      uVar13 = uVar32 - uVar13;
      sVar7 = -(uVar3 >> 5);
      uVar10 = uVar10 | 1;
    }
    *(ushort *)((long)pUVar5 + lStack_f0 * 2 + lVar20) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar5 + (ulong)uVar10 * 2 + lVar20);
    if (uVar13 < 0x1000000) {
      uVar13 = uVar13 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar1 | uVar12 << 8;
    }
    uVar22 = (uVar13 >> 0xb) * (uint)uVar3;
    uVar23 = uVar10 * 2;
    uVar32 = uVar12 - uVar22;
    if (uVar12 < uVar22) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar32 = uVar12;
    }
    else {
      uVar22 = uVar13 - uVar22;
      sVar7 = -(uVar3 >> 5);
      uVar23 = uVar23 | 1;
    }
    *(ushort *)((long)pUVar5 + (ulong)uVar10 * 2 + lVar20) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar5 + (ulong)uVar23 * 2 + lVar20);
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar32 = (uint)bVar1 | uVar32 << 8;
    }
    uVar13 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar10 = uVar23 * 2;
    uVar12 = uVar32 - uVar13;
    if (uVar32 < uVar13) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar12 = uVar32;
    }
    else {
      uVar13 = uVar22 - uVar13;
      sVar7 = -(uVar3 >> 5);
      uVar10 = uVar10 | 1;
    }
    *(ushort *)((long)pUVar5 + (ulong)uVar23 * 2 + lVar20) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar5 + (ulong)uVar10 * 2 + lVar20);
    if (uVar13 < 0x1000000) {
      uVar13 = uVar13 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar1 | uVar12 << 8;
    }
    uVar22 = (uVar13 >> 0xb) * (uint)uVar3;
    uVar23 = uVar10 * 2;
    uVar32 = uVar12 - uVar22;
    if (uVar12 < uVar22) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar32 = uVar12;
    }
    else {
      uVar22 = uVar13 - uVar22;
      sVar7 = -(uVar3 >> 5);
      uVar23 = uVar23 | 1;
    }
    *(ushort *)((long)pUVar5 + (ulong)uVar10 * 2 + lVar20) = sVar7 + uVar3;
    uVar3 = *(ushort *)((long)pUVar5 + (ulong)uVar23 * 2 + lVar20);
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar32 = (uint)bVar1 | uVar32 << 8;
    }
    uVar10 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar13 = uVar23 * 2;
    uVar12 = uVar32 - uVar10;
    if (uVar32 < uVar10) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar12 = uVar32;
    }
    else {
      uVar10 = uVar22 - uVar10;
      sVar7 = -(uVar3 >> 5);
      uVar13 = uVar13 | 1;
    }
    *(ushort *)((long)pUVar5 + (ulong)uVar23 * 2 + lVar20) = sVar7 + uVar3;
    uVar23 = uVar13 - 0x40;
    if (uVar23 < 4) {
LAB_0017d148:
      uVar32 = uVar24;
      if (uVar4 != 0) {
        uVar32 = uVar4;
      }
      if (uVar32 <= uVar23) {
        return 1;
      }
      uVar28 = (uint)(0x12 < uVar28) * 3 + 7;
      local_cc = local_d8;
      local_d8 = local_d4;
      local_d4 = local_dc;
      local_dc = uVar23 + 1;
      goto LAB_0017d19e;
    }
    uVar32 = uVar13 & 1 | 2;
    if (uVar23 < 0xe) {
      iVar14 = (uVar23 >> 1) - 1;
      uVar31 = (ulong)(uVar32 << ((byte)iVar14 & 0x1f));
      uVar25 = (ulong)uVar23;
      uVar32 = 1;
      uVar15 = uVar31;
      uVar17 = 1;
      do {
        uVar23 = uVar10;
        if (uVar10 < 0x1000000) {
          uVar23 = uVar10 << 8;
          bVar1 = *pbVar29;
          pbVar29 = pbVar29 + 1;
          uVar12 = uVar12 << 8 | (uint)bVar1;
        }
        uVar3 = pUVar5[uVar31 + ((uVar17 + 0x2af) - uVar25)];
        uVar10 = (uVar23 >> 0xb) * (uint)uVar3;
        uVar13 = (int)uVar17 * 2;
        uVar22 = uVar12 - uVar10;
        if (uVar12 < uVar10) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
        }
        else {
          uVar10 = uVar23 - uVar10;
          sVar7 = -(uVar3 >> 5);
          uVar13 = uVar13 | 1;
          uVar15 = (ulong)((uint)uVar15 | uVar32);
          uVar12 = uVar22;
        }
        uVar23 = (uint)uVar15;
        pUVar5[uVar31 + ((uVar17 + 0x2af) - uVar25)] = sVar7 + uVar3;
        uVar32 = uVar32 * 2;
        iVar14 = iVar14 + -1;
        uVar17 = (ulong)uVar13;
      } while (iVar14 != 0);
      goto LAB_0017d148;
    }
    iVar14 = (uVar23 >> 1) - 5;
    do {
      uVar23 = uVar10;
      if (uVar10 < 0x1000000) {
        bVar1 = *pbVar29;
        pbVar29 = pbVar29 + 1;
        uVar12 = (uint)bVar1 | uVar12 << 8;
        uVar23 = uVar10 << 8;
      }
      uVar10 = uVar23 >> 1;
      uVar13 = (int)(uVar12 - uVar10) >> 0x1f;
      uVar32 = uVar13 + uVar32 * 2 + 1;
      uVar12 = (uVar13 & uVar10) + (uVar12 - uVar10);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    if (uVar23 < 0x2000000) {
      uVar10 = uVar10 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar1 | uVar12 * 0x100;
    }
    uVar23 = uVar32 * 0x10;
    uVar3 = pUVar5[0x323];
    uVar13 = (uVar10 >> 0xb) * (uint)uVar3;
    uVar32 = uVar12 - uVar13;
    if (uVar12 < uVar13) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      lStack_f0 = 2;
      uVar32 = uVar12;
    }
    else {
      uVar13 = uVar10 - uVar13;
      sVar7 = -(uVar3 >> 5);
      uVar23 = uVar23 | 1;
      lStack_f0 = 3;
    }
    pUVar5[0x323] = sVar7 + uVar3;
    if (uVar13 < 0x1000000) {
      uVar13 = uVar13 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar32 = (uint)bVar1 | uVar32 << 8;
    }
    uVar3 = pUVar5[lStack_f0 + 0x322];
    uVar22 = (uVar13 >> 0xb) * (uint)uVar3;
    uVar10 = (int)lStack_f0 * 2;
    uVar12 = uVar32 - uVar22;
    if (uVar32 < uVar22) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar12 = uVar32;
    }
    else {
      uVar22 = uVar13 - uVar22;
      sVar7 = -(uVar3 >> 5);
      uVar10 = uVar10 | 1;
      uVar23 = uVar23 | 2;
    }
    pUVar5[lStack_f0 + 0x322] = sVar7 + uVar3;
    uVar3 = pUVar5[(ulong)uVar10 + 0x322];
    if (uVar22 < 0x1000000) {
      uVar22 = uVar22 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar1 | uVar12 << 8;
    }
    uVar26 = (uVar22 >> 0xb) * (uint)uVar3;
    uVar32 = uVar10 * 2;
    uVar13 = uVar12 - uVar26;
    if (uVar12 < uVar26) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar13 = uVar12;
    }
    else {
      uVar26 = uVar22 - uVar26;
      sVar7 = -(uVar3 >> 5);
      uVar32 = uVar32 | 1;
      uVar23 = uVar23 | 4;
    }
    pUVar5[(ulong)uVar10 + 0x322] = sVar7 + uVar3;
    uVar3 = pUVar5[(ulong)uVar32 + 0x322];
    if (uVar26 < 0x1000000) {
      uVar26 = uVar26 << 8;
      bVar1 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar13 = (uint)bVar1 | uVar13 << 8;
    }
    uVar10 = (uVar26 >> 0xb) * (uint)uVar3;
    uVar12 = uVar13 - uVar10;
    if (uVar13 < uVar10) {
      sVar7 = (short)(0x800 - uVar3 >> 5);
      uVar12 = uVar13;
    }
    else {
      uVar10 = uVar26 - uVar10;
      sVar7 = -(uVar3 >> 5);
      uVar23 = uVar23 | 8;
    }
    pUVar5[(ulong)uVar32 + 0x322] = sVar7 + uVar3;
    if (uVar23 != 0xffffffff) goto LAB_0017d148;
    uVar19 = uVar19 + 0x112;
    uVar28 = uVar28 - 0xc;
LAB_0017d240:
    if (uVar10 < 0x1000000) {
      uVar10 = uVar10 << 8;
      bVar2 = *pbVar29;
      pbVar29 = pbVar29 + 1;
      uVar12 = (uint)bVar2 | uVar12 << 8;
    }
    p->buf = pbVar29;
    p->range = uVar10;
    p->code = uVar12;
    p->remainLen = uVar19;
    p->dicPos = uVar27;
    p->processedPos = uVar24;
    p->reps[0] = local_dc;
    p->reps[1] = local_d4;
    p->reps[2] = local_d8;
    p->reps[3] = local_cc;
    p->state = uVar28;
    uVar4 = (p->prop).dicSize;
    if (uVar4 <= uVar24) {
      p->checkDicSize = uVar4;
    }
    LzmaDec_WriteRem(p,limit);
    uVar27 = p->dicPos;
    if (limit <= uVar27) {
      uVar24 = p->remainLen;
LAB_0017d2f6:
      if (0x112 < uVar24) {
        p->remainLen = 0x112;
      }
      return 0;
    }
    uVar24 = p->remainLen;
    if ((bufLimit <= p->buf) || (0x111 < uVar24)) goto LAB_0017d2f6;
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec* p, SizeT limit, const Byte* bufLimit) {
  do {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0) {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    if (p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    LzmaDec_WriteRem(p, limit);
  } while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart) {
    p->remainLen = kMatchSpecLenStart;
  }
  return 0;
}